

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  size_type sVar1;
  const_iterator pcVar2;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  char *it;
  size_type local_40;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> v_local;
  
  v_local.data_ = (const_pointer)v.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)v.data_;
  sVar1 = size(this);
  if (pos < sVar1) {
    pcVar2 = cbegin(this);
    __last1 = cend(this);
    __first2 = cbegin((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __last2 = cend((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    it = std::find_first_of<char_const*,char_const*,bool(*)(char_const&,char_const&)>
                   (pcVar2 + pos,__last1,__first2,__last2,std::char_traits<char>::eq);
    local_40 = to_pos(this,it);
  }
  else {
    local_40 = 0xffffffffffffffff;
  }
  return local_40;
}

Assistant:

nssv_constexpr size_type find_first_of(basic_string_view v, size_type pos = 0) const nssv_noexcept  // (1)
		{
			return pos >= size() ? npos
								 : to_pos(std::find_first_of(cbegin() + pos, cend(), v.cbegin(), v.cend(), Traits::eq));
		}